

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O0

void Am_Standard_Open_From_Filename(Am_Object *command_obj,Am_String *filename)

{
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  Am_Value_List *pAVar4;
  Am_Value *value;
  ostream *poVar5;
  Am_Object local_2c0;
  undefined1 local_2b8 [8];
  Am_Handle_Loaded_Items_Method method;
  Am_Value_List loaded;
  Am_Value_List local_288;
  undefined1 local_278 [8];
  Am_Value contents;
  Am_Value_List local_260;
  Am_Value_List local_250;
  long local_240;
  ifstream in_file;
  Am_String local_28;
  Am_String local_20;
  Am_String *local_18;
  Am_String *filename_local;
  Am_Object *command_obj_local;
  
  local_18 = filename;
  filename_local = (Am_String *)command_obj;
  Am_String::Am_String(&local_28,filename);
  remove_extra_quotes(&local_20);
  Am_String::operator=(filename,&local_20);
  Am_String::~Am_String(&local_20);
  Am_String::~Am_String(&local_28);
  set_default_filename(command_obj,filename);
  pcVar3 = Am_String::operator_cast_to_char_(filename);
  std::ifstream::ifstream(&local_240,pcVar3,_S_in);
  bVar1 = std::ios::operator!((ios *)((long)&local_240 + *(long *)(local_240 + -0x18)));
  if ((bVar1 & 1) == 0) {
    Am_Load_Save_Context::Reset(&Am_Default_Load_Save_Context);
    Am_Load_Save_Context::Load
              ((Am_Load_Save_Context *)local_278,(istream *)&Am_Default_Load_Save_Context);
    bVar2 = Am_Value::Valid((Am_Value *)local_278);
    if ((bVar2) && (bVar2 = Am_Value_List::Test((Am_Value *)local_278), bVar2)) {
      Am_Value_List::Am_Value_List((Am_Value_List *)&method.Call,(Am_Value *)local_278);
      value = Am_Object::Get(command_obj,0x19b,0);
      Am_Handle_Loaded_Items_Method::Am_Handle_Loaded_Items_Method
                ((Am_Handle_Loaded_Items_Method *)local_2b8,value);
      bVar2 = Am_Handle_Loaded_Items_Method::Valid((Am_Handle_Loaded_Items_Method *)local_2b8);
      if (!bVar2) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
        poVar5 = std::operator<<(poVar5,"Open Command ");
        poVar5 = operator<<(poVar5,command_obj);
        poVar5 = std::operator<<(poVar5," must have a method in Am_HANDLE_OPEN_SAVE_METHOD slot");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        Am_Error();
      }
      Am_Object::Am_Object(&local_2c0,command_obj);
      (*(code *)method.from_wrapper)(&local_2c0,&method.Call);
      Am_Object::~Am_Object(&local_2c0);
      Am_Value_List::~Am_Value_List((Am_Value_List *)&method.Call);
      contents.value.long_value._4_4_ = 0;
    }
    else {
      Am_Value_List::Am_Value_List((Am_Value_List *)&loaded.item);
      pAVar4 = Am_Value_List::Add((Am_Value_List *)&loaded.item,"File does not contain valid data:",
                                  Am_TAIL,true);
      pAVar4 = Am_Value_List::Add(pAVar4,filename,Am_TAIL,true);
      Am_Value_List::Am_Value_List(&local_288,pAVar4);
      Am_Show_Alert_Dialog(&local_288,-10000,-10000,true);
      Am_Value_List::~Am_Value_List(&local_288);
      Am_Value_List::~Am_Value_List((Am_Value_List *)&loaded.item);
      contents.value.long_value._4_4_ = 1;
    }
    Am_Value::~Am_Value((Am_Value *)local_278);
  }
  else {
    Am_Value_List::Am_Value_List(&local_260);
    pAVar4 = Am_Value_List::Add(&local_260,"File could not be opened:",Am_TAIL,true);
    pAVar4 = Am_Value_List::Add(pAVar4,filename,Am_TAIL,true);
    Am_Value_List::Am_Value_List(&local_250,pAVar4);
    Am_Show_Alert_Dialog(&local_250,-10000,-10000,true);
    Am_Value_List::~Am_Value_List(&local_250);
    Am_Value_List::~Am_Value_List(&local_260);
    contents.value.long_value._4_4_ = 1;
  }
  std::ifstream::~ifstream(&local_240);
  return;
}

Assistant:

void
Am_Standard_Open_From_Filename(Am_Object command_obj, Am_String filename)
{
  filename = remove_extra_quotes(filename);
  set_default_filename(command_obj, filename);
  std::ifstream in_file((const char *)filename, std::ios::in);
  if (!in_file) {
    Am_Show_Alert_Dialog(
        Am_Value_List().Add("File could not be opened:").Add(filename));
    return;
  }
  Am_Default_Load_Save_Context.Reset();
  Am_Value contents = Am_Default_Load_Save_Context.Load(in_file);
  if (!contents.Valid() || !Am_Value_List::Test(contents)) {
    Am_Show_Alert_Dialog(
        Am_Value_List().Add("File does not contain valid data:").Add(filename));
    return;
  }
  Am_Value_List loaded = contents;
  Am_Handle_Loaded_Items_Method method =
      command_obj.Get(Am_HANDLE_OPEN_SAVE_METHOD);
  if (method.Valid())
    method.Call(command_obj, loaded);
  else
    Am_ERRORO("Open Command "
                  << command_obj
                  << " must have a method in Am_HANDLE_OPEN_SAVE_METHOD slot",
              command_obj, Am_HANDLE_OPEN_SAVE_METHOD);
}